

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O1

void __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter::operator()(deleter *this,int *ptr)

{
  cow_guarded<int,_std::timed_mutex> *this_00;
  shared_ptr<const_int> newPtr;
  anon_class_16_1_629f9e6c local_30;
  int *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (this->m_cancelled == true) {
    if (ptr != (int *)0x0) {
      operator_delete(ptr,4);
    }
  }
  else if (ptr != (int *)0x0) {
    local_20 = ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_18,ptr);
    this_00 = this->m_guarded;
    local_30.newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
    local_30.newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_18._M_pi;
    if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      }
    }
    lr_guarded<std::shared_ptr<int_const>,std::mutex>::operator()
              ((lr_guarded<std::shared_ptr<int_const>,std::mutex> *)this_00,&local_30);
    if (local_30.newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    }
  }
  if ((this->m_lock)._M_owns == true) {
    std::unique_lock<std::timed_mutex>::unlock(&this->m_lock);
  }
  return;
}

Assistant:

void operator()(T* ptr)
        {
            if (m_cancelled) {
                delete ptr;
            } else if (ptr) {
                std::shared_ptr<const T> newPtr(ptr);

                m_guarded.m_data.modify(
                    [newPtr](std::shared_ptr<const T>& sptr) {
                        sptr = newPtr;
                    });
            }

            if (m_lock.owns_lock()) {
                m_lock.unlock();
            }
        }